

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

void __thiscall
rr::FragmentProcessor::executeColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,bool isSRGB,PixelBufferAccess *colorBuffer)

{
  int i;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  Vec3 *pVVar4;
  Vec4 combinedColor;
  Vec4 local_68;
  Fragment *local_58;
  PixelBufferAccess *local_50;
  Vec4 *local_48;
  float afStack_40 [4];
  
  pVVar4 = &this->m_sampleRegister[0].blendedRGB;
  uVar3 = 0;
  local_58 = inputFragments;
  local_50 = colorBuffer;
  do {
    if (this->m_sampleRegister[uVar3].isAlive == true) {
      uVar2 = (int)uVar3 >> 0x1f;
      local_68.m_data._0_8_ = (Vec4 *)0x0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      local_48 = &local_68;
      afStack_40[0] = 0.0;
      afStack_40[1] = 1.4013e-45;
      afStack_40[2] = 2.8026e-45;
      lVar1 = 0;
      do {
        local_68.m_data[(int)afStack_40[lVar1]] = pVVar4->m_data[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      local_68.m_data[3] = this->m_sampleRegister[uVar3].blendedA;
      if (isSRGB) {
        tcu::linearToSRGB((tcu *)&local_48,&local_68);
        local_68.m_data._0_8_ = local_48;
        local_68.m_data[2] = afStack_40[0];
        local_68.m_data[3] = afStack_40[1];
      }
      tcu::PixelBufferAccess::setPixel
                (local_50,&local_68,
                 (int)((long)((ulong)uVar2 << 0x20 | uVar3 & 0xffffffff) %
                      (long)numSamplesPerFragment),
                 local_58[(int)((long)((ulong)uVar2 << 0x20 | uVar3 & 0xffffffff) /
                               (long)numSamplesPerFragment) + fragNdxOffset].pixelCoord.m_data[0],
                 local_58[(int)((long)((ulong)uVar2 << 0x20 | uVar3 & 0xffffffff) /
                               (long)numSamplesPerFragment) + fragNdxOffset].pixelCoord.m_data[1]);
    }
    uVar3 = uVar3 + 1;
    pVVar4 = pVVar4 + 0xb;
  } while (uVar3 != 0x40);
  return;
}

Assistant:

void FragmentProcessor::executeColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, bool isSRGB, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			Vec4				combinedColor;

			combinedColor.xyz()	= m_sampleRegister[regSampleNdx].blendedRGB;
			combinedColor.w()	= m_sampleRegister[regSampleNdx].blendedA;

			if (isSRGB)
				combinedColor = tcu::linearToSRGB(combinedColor);

			colorBuffer.setPixel(combinedColor, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}